

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O0

void nn_req_action_send(nn_req *self,int allow_delay)

{
  int iVar1;
  char *pcVar2;
  int in_ESI;
  long in_RDI;
  nn_pipe *to;
  nn_msg msg;
  int rc;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  nn_timer *in_stack_ffffffffffffff80;
  FILE *__stream;
  nn_pipe **in_stack_ffffffffffffff88;
  nn_msg *in_stack_ffffffffffffff90;
  nn_sockbase *in_stack_ffffffffffffff98;
  
  nn_msg_cp((nn_msg *)in_stack_ffffffffffffff80,
            (nn_msg *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  iVar1 = nn_xreq_send_to(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                          in_stack_ffffffffffffff88);
  if (iVar1 == -0xb) {
    if (in_ESI != 1) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","allow_delay == 1",
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/reqrep/req.c"
              ,0x268);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_msg_term((nn_msg *)0x2f727e);
    *(undefined4 *)(in_RDI + 0x378) = 3;
  }
  else {
    if (iVar1 != 0) {
      nn_backtrace_print();
      __stream = _stderr;
      pcVar2 = nn_err_strerror(in_stack_ffffffffffffff7c);
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar2,(ulong)(uint)-iVar1,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/reqrep/req.c"
              ,0x27a);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_timer_start(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    if (in_stack_ffffffffffffff88 == (nn_pipe **)0x0) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","to",
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/reqrep/req.c"
              ,0x273);
      fflush(_stderr);
      nn_err_abort();
    }
    *(nn_pipe ***)(in_RDI + 0x538) = in_stack_ffffffffffffff88;
    *(undefined4 *)(in_RDI + 0x378) = 4;
  }
  return;
}

Assistant:

void nn_req_action_send (struct nn_req *self, int allow_delay)
{
    int rc;
    struct nn_msg msg;
    struct nn_pipe *to;

    /*  Send the request. */
    nn_msg_cp (&msg, &self->task.request);
    rc = nn_xreq_send_to (&self->xreq.sockbase, &msg, &to);

    /*  If the request cannot be sent at the moment wait till
        new outbound pipe arrives. */
    if (nn_slow (rc == -EAGAIN)) {
        nn_assert (allow_delay == 1);
        nn_msg_term (&msg);
        self->state = NN_REQ_STATE_DELAYED;
        return;
    }

    /*  Request was successfully sent. Set up the re-send timer
        in case the request gets lost somewhere further out
        in the topology. */
    if (nn_fast (rc == 0)) {
        nn_timer_start (&self->task.timer, self->resend_ivl);
        nn_assert (to);
        self->task.sent_to = to;
        self->state = NN_REQ_STATE_ACTIVE;
        return;
    }

    /*  Unexpected error. */
    errnum_assert (0, -rc);
}